

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O3

void __thiscall r_exec::CSTOverlay::inject_production(CSTOverlay *this)

{
  pointer pPVar1;
  _Object *p_Var2;
  _Fact *target;
  ulong after;
  Pred *pPVar3;
  Fact *pFVar4;
  uint64_t uVar5;
  ostream *poVar6;
  _func_int **pp_Var7;
  _Hash_node_base *p_Var8;
  pointer pPVar9;
  uint64_t time_to_live;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  target = &CSTController::get_f_icst
                      ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,
                       (HLPBindingMap *)(this->super_HLPOverlay).bindings.object,&this->inputs)->
            super__Fact;
  after = (*Now)();
  if ((this->simulations)._M_h._M_element_count != 0) {
    pPVar3 = (Pred *)operator_new(0x180);
    Pred::Pred(pPVar3,target,1.0);
    pFVar4 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)target);
    Fact::Fact(pFVar4,(Code *)pPVar3,after,after,1.0,1.0);
    p_Var8 = (this->simulations)._M_h._M_before_begin._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      do {
        std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::push_back
                  (&pPVar3->simulations,(value_type *)(p_Var8 + 1));
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)0x0);
    }
    HLPController::inject_prediction
              ((HLPController *)(this->super_HLPOverlay).super_Overlay.controller,pFVar4,
               this->lowest_cfd);
    return;
  }
  uVar5 = BindingMap::get_fwd_before((BindingMap *)(this->super_HLPOverlay).bindings.object);
  time_to_live = 0;
  if (after <= uVar5) {
    time_to_live = uVar5 - after;
  }
  if ((this->predictions)._M_h._M_element_count == 0) {
    CSTController::inject_icst
              ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,(Fact *)target,
               this->lowest_cfd,time_to_live);
    poVar6 = _Mem::Output(CST_OUT);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&local_50);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t\t\t\t",4);
    (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[2])(target);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," icst[",6);
    (*((((this->super_HLPOverlay).super_Overlay.controller)->view->object).object)->_vptr__Object[2]
    )();
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"][",2);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    pPVar1 = (this->inputs).
             super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar9 = (this->inputs).
                  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar9 != pPVar1; pPVar9 = pPVar9 + 1)
    {
      p_Var2 = pPVar9->object;
      if (p_Var2 != (_Object *)0x0) {
        LOCK();
        (p_Var2->refCount).super___atomic_base<long>._M_i =
             (p_Var2->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
      }
      poVar6 = _Mem::Output(CST_OUT);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      (*p_Var2->_vptr__Object[2])(p_Var2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      LOCK();
      (p_Var2->refCount).super___atomic_base<long>._M_i =
           (p_Var2->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if ((p_Var2->refCount).super___atomic_base<long>._M_i < 1) {
        (*p_Var2->_vptr__Object[1])(p_Var2);
      }
    }
    poVar6 = _Mem::Output(CST_OUT);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
    pp_Var7 = poVar6->_vptr_basic_ostream;
  }
  else {
    pPVar3 = (Pred *)operator_new(0x180);
    Pred::Pred(pPVar3,target,1.0);
    pFVar4 = (Fact *)Fact::operator_new((Fact *)0x150,(size_t)target);
    Fact::Fact(pFVar4,(Code *)pPVar3,after,after,1.0,1.0);
    p_Var8 = (this->predictions)._M_h._M_before_begin._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      do {
        std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::push_back
                  (&pPVar3->grounds,(value_type *)(p_Var8 + 1));
        p_Var8 = p_Var8->_M_nxt;
      } while (p_Var8 != (_Hash_node_base *)0x0);
    }
    CSTController::inject_prediction
              ((CSTController *)(this->super_HLPOverlay).super_Overlay.controller,pFVar4,
               this->lowest_cfd,time_to_live);
    poVar6 = _Mem::Output(CST_OUT);
    (*Now)();
    r_code::Utils::RelativeTime_abi_cxx11_((ulong)&local_50);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t\t\t\t",4);
    (**(code **)((long)(pFVar4->super__Fact).super_LObject.
                       super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                       super__Object._vptr__Object + 0x10))(pFVar4);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," pred icst[",0xb);
    (*((((this->super_HLPOverlay).super_Overlay.controller)->view->object).object)->_vptr__Object[2]
    )();
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"][",2);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    pPVar1 = (this->inputs).
             super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar9 = (this->inputs).
                  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar9 != pPVar1; pPVar9 = pPVar9 + 1)
    {
      p_Var2 = pPVar9->object;
      if (p_Var2 != (_Object *)0x0) {
        LOCK();
        (p_Var2->refCount).super___atomic_base<long>._M_i =
             (p_Var2->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
      }
      poVar6 = _Mem::Output(CST_OUT);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      (*p_Var2->_vptr__Object[2])(p_Var2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      LOCK();
      (p_Var2->refCount).super___atomic_base<long>._M_i =
           (p_Var2->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if ((p_Var2->refCount).super___atomic_base<long>._M_i < 1) {
        (*p_Var2->_vptr__Object[1])(p_Var2);
      }
    }
    poVar6 = _Mem::Output(CST_OUT);
    pp_Var7 = poVar6->_vptr_basic_ostream;
  }
  std::ios::widen((char)pp_Var7[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void CSTOverlay::inject_production()
{
    Fact *f_icst = ((CSTController *)controller)->get_f_icst(bindings, &inputs);
    uint64_t now = Now(); //f_icst->get_reference(0)->trace();

    if (simulations.size() == 0) { // no simulation.
        uint64_t before = bindings->get_fwd_before();
        uint64_t time_to_live;

        if (now >= before) {
            time_to_live = 0;
        } else {
            time_to_live = before - now;
        }

        if (predictions.size()) {
            Pred *prediction = new Pred(f_icst, 1);
            Fact *f_p_f_icst = new Fact(prediction, now, now, 1, 1);
            std::unordered_set<P<_Fact>, PHash<_Fact> >::const_iterator pred;

            for (pred = predictions.begin(); pred != predictions.end(); ++pred) { // add antecedents to the prediction.
                prediction->grounds.push_back(*pred);
            }

            ((CSTController *)controller)->inject_prediction(f_p_f_icst, lowest_cfd, time_to_live); // inject a f->pred->icst in the primary group, no rdx.
            OUTPUT(CST_OUT) << Utils::RelativeTime(Now()) << "				" << f_p_f_icst->get_oid() << " pred icst[" << controller->getObject()->get_oid() << "][";

            for (P<_Fact> input : inputs) {
                OUTPUT(CST_OUT) << " " << input->get_oid();
            }

            OUTPUT(CST_OUT) << std::endl;
        } else {
            ((CSTController *)controller)->inject_icst(f_icst, lowest_cfd, time_to_live); // inject f->icst in the primary and secondary groups, and in the output groups.
            OUTPUT(CST_OUT) << Utils::RelativeTime(Now()) << "				" << f_icst->get_oid() << " icst[" << controller->getObject()->get_oid() << "][";

            for (P<_Fact> input : inputs) {
                OUTPUT(CST_OUT) << " " << input->get_oid();
            }

            OUTPUT(CST_OUT) << "]" << std::endl;
        }
    } else { // there are simulations; the production is therefore a prediction; add the simulations to the latter.
        Pred *prediction = new Pred(f_icst, 1);
        Fact *f_p_f_icst = new Fact(prediction, now, now, 1, 1);
        std::unordered_set<P<Sim>, PHash<Sim> >::const_iterator sim;

        for (sim = simulations.begin(); sim != simulations.end(); ++sim) { // add simulations to the prediction.
            prediction->simulations.push_back(*sim);
        }

        ((HLPController *)controller)->inject_prediction(f_p_f_icst, lowest_cfd); // inject a simulated prediction in the main group.
    }
}